

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_vumeter.c
# Opt level: O0

void vu_draw_update(t_gobj *client,_glist *glist)

{
  t_vu *x;
  _glist *glist_local;
  t_gobj *client_local;
  
  if (((ulong)client[0x4b].g_next & 1) != 0) {
    vu_update_rms((t_vu *)client,glist);
    *(byte *)&client[0x4b].g_next = *(byte *)&client[0x4b].g_next & 0xfe;
  }
  if ((*(byte *)&client[0x4b].g_next >> 1 & 1) != 0) {
    vu_update_peak((t_vu *)client,glist);
    *(byte *)&client[0x4b].g_next = *(byte *)&client[0x4b].g_next & 0xfd;
  }
  return;
}

Assistant:

static void vu_draw_update(t_gobj *client, t_glist *glist)
{
    t_vu *x = (t_vu *)client;
    if (x->x_updaterms)
    {
        vu_update_rms(x, glist);
        x->x_updaterms = 0;
    }
    if (x->x_updatepeak)
    {
        vu_update_peak(x, glist);
        x->x_updatepeak = 0;
    }
}